

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void check_call_unroll(jit_State *J,TraceNo lnk)

{
  int iVar1;
  uint uVar2;
  TValue *pTVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  TValue *pTVar7;
  
  iVar1 = J->framedepth;
  iVar5 = (int)((char)(J->pt->flags << 6) >> 7);
  iVar6 = iVar5 + iVar1;
  if (iVar6 == 0 || SCARRY4(iVar5,iVar1) != iVar6 < 0) {
    iVar5 = 0;
  }
  else {
    pTVar3 = J->L->base;
    pTVar7 = pTVar3 + -1;
    iVar5 = 0;
    do {
      uVar2 = (pTVar7->field_2).it;
      if (((long)(int)uVar2 & 3U) == 0) {
        pTVar7 = pTVar7 + (-1 - (ulong)*(byte *)((ulong)uVar2 - 3));
      }
      else {
        pTVar7 = (TValue *)((long)pTVar7 - ((long)(int)uVar2 & 0xfffffffffffffff8U));
      }
      iVar5 = iVar5 + (uint)(*(int *)((ulong)(pTVar7->u32).lo + 0x10) ==
                            *(int *)((ulong)pTVar3[-1].u32.lo + 0x10));
      iVar6 = (iVar6 - (uint)((uVar2 & 7) == 2)) + -1;
    } while (0 < iVar6);
  }
  if (J->pc == J->startpc) {
    if (J->param[0xc] < iVar5 + J->tailcalled) {
      J->pc = J->pc + 1;
      lj_record_stop(J,(iVar1 + J->retdepth != 0) + LJ_TRLINK_TAILREC,(uint)(J->cur).traceno);
      return;
    }
  }
  else if (J->param[0xb] < iVar5) {
    if (lnk != 0) {
      lj_trace_flush(J,lnk);
      uVar4 = J->prngstate * 0x41c64e6d + 0x3039;
      J->prngstate = uVar4;
      *(ushort *)((long)&J[1].cur.nextgc.gcptr32 + (ulong)(*(int *)&J->pc + 4U >> 1 & 0x7e)) =
           (ushort)(uVar4 >> 0x1c);
    }
    lj_trace_err(J,LJ_TRERR_CUNROLL);
  }
  return;
}

Assistant:

static void check_call_unroll(jit_State *J, TraceNo lnk)
{
  cTValue *frame = J->L->base - 1;
  void *pc = mref(frame_func(frame)->l.pc, void);
  int32_t depth = J->framedepth;
  int32_t count = 0;
  if ((J->pt->flags & PROTO_VARARG)) depth--;  /* Vararg frame still missing. */
  for (; depth > 0; depth--) {  /* Count frames with same prototype. */
    if (frame_iscont(frame)) depth--;
    frame = frame_prev(frame);
    if (mref(frame_func(frame)->l.pc, void) == pc)
      count++;
  }
  if (J->pc == J->startpc) {
    if (count + J->tailcalled > J->param[JIT_P_recunroll]) {
      J->pc++;
      if (J->framedepth + J->retdepth == 0)
	lj_record_stop(J, LJ_TRLINK_TAILREC, J->cur.traceno);  /* Tail-rec. */
      else
	lj_record_stop(J, LJ_TRLINK_UPREC, J->cur.traceno);  /* Up-recursion. */
    }
  } else {
    if (count > J->param[JIT_P_callunroll]) {
      if (lnk) {  /* Possible tail- or up-recursion. */
	lj_trace_flush(J, lnk);  /* Flush trace that only returns. */
	/* Set a small, pseudo-random hotcount for a quick retry of JFUNC*. */
	hotcount_set(J2GG(J), J->pc+1, LJ_PRNG_BITS(J, 4));
      }
      lj_trace_err(J, LJ_TRERR_CUNROLL);
    }
  }
}